

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O2

void __thiscall
OpenSteer::DrawSphereHelper::drawTriangleOnSphere(DrawSphereHelper *this,Vec3 *a,Vec3 *b,Vec3 *c)

{
  uint uVar1;
  uint uVar2;
  Vec3 *c_00;
  Color *pCVar3;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar4 [16];
  Vec3 VVar5;
  Vec3 VVar6;
  float local_78;
  float fStack_74;
  Vec3 local_50;
  Vec3 local_40;
  
  local_50 = Vec3::operator+(a,b);
  VVar5 = Vec3::operator+(&local_50,c);
  auVar4._0_8_ = VVar5._0_8_;
  auVar4._8_8_ = extraout_XMM0_Qb;
  auVar4 = divps(auVar4,_DAT_00141250);
  local_40.z = VVar5.z / 3.0;
  local_40._0_8_ = auVar4._0_8_;
  VVar5 = Vec3::operator-(&local_40,&this->center);
  local_50 = VVar5;
  VVar6 = Vec3::operator-(&local_40,&this->viewpoint);
  local_78 = VVar5.x;
  fStack_74 = VVar5.y;
  uVar1._0_1_ = this->drawFrontFacing;
  uVar1._1_1_ = this->drawBackFacing;
  uVar1._2_2_ = *(undefined2 *)&this->field_0x2a;
  uVar2 = (uint)this->drawBackFacing;
  if (VVar5.z * VVar6.z + local_78 * VVar6.x + VVar6.y * fStack_74 <= 0.0) {
    uVar2 = uVar1;
  }
  if ((uVar2 & 1) != 0) {
    if (this->filled == true) {
      c_00 = c;
      if ((uVar1 & 1) != 0) {
        c_00 = a;
        a = c;
      }
      anon_unknown.dwarf_1ac78::iDrawTriangle(a,b,c_00,&this->color);
    }
    else {
      VVar5 = Vec3::normalize(&local_50);
      if ((ABS(VVar6.z * VVar5.z + VVar5.x * VVar6.x + VVar6.y * VVar5.y) <= -0.05) ||
         ((this->drawBackFacing == true && (this->drawFrontFacing != false)))) {
        pCVar3 = &this->color;
        drawMeshedTriangleLine(this,a,b,pCVar3);
        drawMeshedTriangleLine(this,b,c,pCVar3);
        drawMeshedTriangleLine(this,c,a,pCVar3);
      }
      else {
        pCVar3 = &this->color;
        anon_unknown.dwarf_1ac78::iDrawLine(a,b,pCVar3);
        anon_unknown.dwarf_1ac78::iDrawLine(b,c,pCVar3);
        anon_unknown.dwarf_1ac78::iDrawLine(c,a,pCVar3);
      }
    }
  }
  return;
}

Assistant:

void drawTriangleOnSphere (const Vec3& a, 
                                   const Vec3& b,
                                   const Vec3& c) const
        {
            // draw triangle, subject to the camera orientation criteria
            // (according to drawBackFacing and drawFrontFacing)
            const Vec3 triCenter = (a + b + c) / 3.0f;
            const Vec3 triNormal = triCenter - center; // not unit length
            const Vec3 view = triCenter - viewpoint;
            const float dot = view.dot (triNormal); // project normal on view
            const bool seen = ((dot>0.0f) ? drawBackFacing : drawFrontFacing);
            if (seen)
            {
                if (filled)
                {
                    // draw filled triangle
                    if (drawFrontFacing)
                        drawTriangle (c, b, a, color);
                    else
                        drawTriangle (a, b, c, color);
                }
                else
                {
                    // draw triangle edges (use trick to avoid drawing each
                    // edge twice (for each adjacent triangle) unless we are
                    // culling and this tri is near the sphere's silhouette)
                    const float unitDot = view.dot (triNormal.normalize ());
                    const float t = 0.05f; // near threshold
                    const bool nearSilhouette = (unitDot<t) || (unitDot>-t);
                    if (nearSilhouette && !(drawBackFacing&&drawFrontFacing))
                    {
                        drawLine (a, b, color);
                        drawLine (b, c, color);
                        drawLine (c, a, color);
                    }
                    else
                    {
                        drawMeshedTriangleLine (a, b, color);
                        drawMeshedTriangleLine (b, c, color);
                        drawMeshedTriangleLine (c, a, color);
                    }
                }
            }
        }